

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiameterDimension,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcDiameterDimension *in;
  
  in = (IfcDiameterDimension *)operator_new(0x80);
  *(undefined ***)&(in->super_IfcDimensionCurveDirectedCallout).field_0x68 = &PTR__Object_00806870;
  *(undefined8 *)&in->field_0x70 = 0;
  *(char **)&in->field_0x78 = "IfcDiameterDimension";
  Assimp::IFC::Schema_2x3::IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            ((IfcDimensionCurveDirectedCallout *)in,&PTR_construction_vtable_24__0087adb8);
  (in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDiameterDimension_0087acd8;
  *(undefined ***)&(in->super_IfcDimensionCurveDirectedCallout).field_0x68 =
       &PTR__IfcDiameterDimension_0087ada0;
  *(undefined ***)
   &(in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcDiameterDimension_0087ad00;
  *(undefined ***)
   &(in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcDiameterDimension_0087ad28;
  *(undefined ***)
   &(in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x48 =
       &PTR__IfcDiameterDimension_0087ad50;
  *(undefined ***)
   &(in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58 =
       &PTR__IfcDiameterDimension_0087ad78;
  GenericFill<Assimp::IFC::Schema_2x3::IfcDiameterDimension>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
                 super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
               super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }